

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_trytogetmoreguibuf(int newsize)

{
  _instanceinter *p_Var1;
  char *pcVar2;
  ssize_t sVar3;
  size_t __n;
  uint uVar4;
  ulong uVar5;
  
  if ((-1 < newsize) &&
     (pcVar2 = (char *)realloc((pd_maininstance.pd_inter)->i_guibuf,(ulong)(uint)newsize),
     p_Var1 = pd_maininstance.pd_inter, pcVar2 != (char *)0x0)) {
    (pd_maininstance.pd_inter)->i_guisize = newsize;
    p_Var1->i_guibuf = pcVar2;
    return;
  }
  __n = (long)(pd_maininstance.pd_inter)->i_guihead - (long)(pd_maininstance.pd_inter)->i_guitail;
  uVar4 = 0;
  do {
    uVar5 = (ulong)(uint)(pd_maininstance.pd_inter)->i_guisock;
    sVar3 = send((pd_maininstance.pd_inter)->i_guisock,
                 (pd_maininstance.pd_inter)->i_guibuf +
                 (ulong)uVar4 + (long)(pd_maininstance.pd_inter)->i_guitail,__n,0);
    if ((int)sVar3 < 0) {
      sys_trytogetmoreguibuf_cold_1();
      sys_vgui("%s",uVar5);
      return;
    }
    uVar4 = uVar4 + (int)sVar3;
  } while ((int)uVar4 < (int)__n);
  p_Var1 = pd_maininstance.pd_inter;
  p_Var1->i_guihead = 0;
  p_Var1->i_guitail = 0;
  return;
}

Assistant:

static void sys_trytogetmoreguibuf(int newsize)
{
        /* newsize can be negative if it overflows (at 0x7FFFFFFF)
         * which only happens if we push a huge amount of data to the GUI,
         * such as printing a billion numbers
         *
         * we could fix this by using size_t (or ssize_t), but this will
         * possibly lead to memory exhaustion.
         * as the overflow happens at 2GB which is rather large anyhow,
         * but most machines will still be able to handle this without swapping
         * and crashing, we just use the 2GB limit to trigger a synchronous write.
	 * also note that on the Tcl/Tk side, the maximum size of a buffer is 2GB,
	 * so there's a nice analogy here.
         */
    char *newbuf = (newsize>=0)?realloc(INTER->i_guibuf, newsize):0;
#if 0
    static int sizewas;
    if (newsize > 70000 && sizewas < 70000)
    {
        int i;
        for (i = INTER->i_guitail; i < INTER->i_guihead; i++)
                fputc(INTER->i_guibuf[i], stderr);
    }
    sizewas = newsize;
#endif
#if 0
    fprintf(stderr, "new size %d (head %d, tail %d)\n",
        newsize, INTER->i_guihead, INTER->i_guitail);
#endif

        /* if realloc fails, make a last-ditch attempt to stay alive by
        synchronously writing out the existing contents.  LATER test
        this by intentionally setting newbuf to zero */
    if (!newbuf)
    {
        int bytestowrite = INTER->i_guihead - INTER->i_guitail;
        int written = 0;
        while (1)
        {
            int res = (int)send(
                INTER->i_guisock,
                INTER->i_guibuf + INTER->i_guitail + written,
                bytestowrite, 0);
            if (res < 0)
            {
                perror("pd output pipe");
                sys_bail(1);
            }
            else
            {
                written += res;
                if (written >= bytestowrite)
                    break;
            }
        }
        INTER->i_guihead = INTER->i_guitail = 0;
    }
    else
    {
        INTER->i_guisize = newsize;
        INTER->i_guibuf = newbuf;
    }
}